

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LevelMixer.cpp
# Opt level: O0

int LevelMixer::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  ulong uVar1;
  UnityAudioParameterDefinition *pUVar2;
  int numparams;
  UnityAudioEffectDefinition *definition_local;
  
  uVar1 = SUB168(ZEXT816(8) * ZEXT816(0x40),0);
  if (SUB168(ZEXT816(8) * ZEXT816(0x40),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pUVar2 = (UnityAudioParameterDefinition *)operator_new__(uVar1);
  definition->paramdefs = pUVar2;
  RegisterParameter(definition,"Gain1","dB",-120.0,50.0,0.0,1.0,1.0,0,
                    "Gain of input channel 1 (left or mono)");
  RegisterParameter(definition,"Gain2","dB",-120.0,50.0,0.0,1.0,1.0,1,
                    "Gain of input channel 2 (right)");
  RegisterParameter(definition,"Gain3","dB",-120.0,50.0,0.0,1.0,1.0,2,"Gain of input channel 3");
  RegisterParameter(definition,"Gain4","dB",-120.0,50.0,0.0,1.0,1.0,3,"Gain of input channel 4");
  RegisterParameter(definition,"Gain5","dB",-120.0,50.0,0.0,1.0,1.0,4,"Gain of input channel 5");
  RegisterParameter(definition,"Gain6","dB",-120.0,50.0,0.0,1.0,1.0,5,"Gain of input channel 6");
  RegisterParameter(definition,"Gain7","dB",-120.0,50.0,0.0,1.0,1.0,6,"Gain of input channel 7");
  RegisterParameter(definition,"Gain8","dB",-120.0,50.0,0.0,1.0,1.0,7,"Gain of input channel 8");
  return 8;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Gain1", "dB", -120.0f, 50.0f, 0.0f, 1.0f, 1.0f, P_GAIN1, "Gain of input channel 1 (left or mono)");
        RegisterParameter(definition, "Gain2", "dB", -120.0f, 50.0f, 0.0f, 1.0f, 1.0f, P_GAIN2, "Gain of input channel 2 (right)");
        RegisterParameter(definition, "Gain3", "dB", -120.0f, 50.0f, 0.0f, 1.0f, 1.0f, P_GAIN3, "Gain of input channel 3");
        RegisterParameter(definition, "Gain4", "dB", -120.0f, 50.0f, 0.0f, 1.0f, 1.0f, P_GAIN4, "Gain of input channel 4");
        RegisterParameter(definition, "Gain5", "dB", -120.0f, 50.0f, 0.0f, 1.0f, 1.0f, P_GAIN5, "Gain of input channel 5");
        RegisterParameter(definition, "Gain6", "dB", -120.0f, 50.0f, 0.0f, 1.0f, 1.0f, P_GAIN6, "Gain of input channel 6");
        RegisterParameter(definition, "Gain7", "dB", -120.0f, 50.0f, 0.0f, 1.0f, 1.0f, P_GAIN7, "Gain of input channel 7");
        RegisterParameter(definition, "Gain8", "dB", -120.0f, 50.0f, 0.0f, 1.0f, 1.0f, P_GAIN8, "Gain of input channel 8");
        return numparams;
    }